

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlatTerm.cpp
# Opt level: O2

FlatTerm * Kernel::FlatTerm::createUnexpanded(TermStack *ts)

{
  TermList *pTVar1;
  ulong uVar2;
  size_t sVar3;
  FlatTerm *pFVar4;
  uint uVar5;
  TermList *tl;
  TermList *pTVar6;
  Term *pTVar7;
  TermList *pTVar8;
  long lVar9;
  TermStack *__range1;
  TermList *tl_1;
  size_t sVar10;
  TermList *pTVar11;
  ulong local_38;
  
  pTVar8 = ts->_cursor;
  sVar10 = 0;
  pTVar7 = (Term *)ts;
  for (pTVar6 = ts->_stack; pTVar6 != pTVar8; pTVar6 = pTVar6 + 1) {
    pTVar7 = (Term *)pTVar6->_content;
    sVar3 = 1;
    if (((ulong)pTVar7 & 1) == 0) {
      sVar3 = getEntryCount(pTVar7);
    }
    sVar10 = sVar10 + sVar3;
  }
  pFVar4 = (FlatTerm *)operator_new((size_t)pTVar7,(uint)sVar10);
  pFVar4->_length = sVar10;
  pTVar1 = ts->_cursor;
  lVar9 = 0;
  for (pTVar11 = ts->_stack; pTVar11 != pTVar1; pTVar11 = pTVar11 + 1) {
    pTVar7 = (Term *)pTVar11->_content;
    if (((ulong)pTVar7 & 1) == 0) {
      uVar2 = pTVar7->_args[0]._content;
      uVar5 = ((uint)(uVar2 >> 2) & 1) + pTVar7->_functor * 2;
      if ((uVar2 & 0x10) == 0) {
        uVar5 = pTVar7->_functor;
      }
      local_38 = (local_38 & 0xffffffffc0000000) + (ulong)((uVar5 & 0x7ffffff) << 3) + 4;
      pFVar4->_data[lVar9]._content = local_38;
      pFVar4[1]._data[lVar9 + -1]._content = (uint64_t)pTVar7;
      sVar10 = getEntryCount(pTVar7);
      pTVar6 = (TermList *)
               (((ulong)pTVar6 & 0xffffffffc0000000) + (ulong)(((uint)sVar10 & 0x7ffffff) << 3) + 3)
      ;
      pFVar4[1]._data[lVar9]._content = (uint64_t)pTVar6;
      sVar10 = getEntryCount(pTVar7);
      lVar9 = lVar9 + sVar10;
    }
    else {
      pTVar8 = (TermList *)
               (((ulong)pTVar8 & 0xffffffffc0000000) + (ulong)((uint)pTVar7 & 0x1ffffffd) * 2);
      pFVar4->_data[lVar9]._content = (uint64_t)pTVar8;
      lVar9 = lVar9 + 1;
    }
  }
  return pFVar4;
}

Assistant:

FlatTerm* FlatTerm::createUnexpanded(TermStack ts)
{
  size_t entries=0;
  for (auto& tl : ts) {
    entries += tl.isVar() ? 1 : getEntryCount(tl.term());
  }

  FlatTerm* res=new(entries) FlatTerm(entries);
  size_t fti=0;

  for (auto& tl : ts) {
    if (tl.isVar()) {
      res->_data[fti++]=Entry(VAR, tl.var());
      continue;
    }
    auto t = tl.term();
    res->_data[fti]=Entry(FUN_UNEXPANDED,
        t->isLiteral() ? static_cast<Literal*>(t)->header() : t->functor());
    res->_data[fti+1]=Entry(t);
    res->_data[fti+2]=Entry(FUN_RIGHT_OFS, getEntryCount(t));
    fti+=getEntryCount(t);
  }
  ASS_EQ(fti, entries);

  return res;
}